

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshCFaceListBlock(Parser *this,uint iNumFaces,Mesh *mesh)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  uint local_34;
  uint local_30;
  uint iIndex;
  uint aiValues [3];
  int iDepth;
  Mesh *mesh_local;
  uint iNumFaces_local;
  Parser *this_local;
  
  aiValues[1] = 0;
  unique0x10000229 = mesh;
  do {
    while (*this->filePtr != '*') {
LAB_006309f4:
      if (*this->filePtr == '{') {
        aiValues[1] = aiValues[1] + 1;
      }
      else if (*this->filePtr == '}') {
        aiValues[1] = aiValues[1] - 1;
        if (aiValues[1] == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_CFACE_LIST chunk (Level 3)")
        ;
      }
      bVar3 = IsLineEnd<char>(*this->filePtr);
      if ((bVar3) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar3 = TokenMatch<char_const>(&this->filePtr,"MESH_CFACE",10);
    if (!bVar3) goto LAB_006309f4;
    local_34 = 0;
    ParseLV4MeshLongTriple(this,&local_30,&local_34);
    if ((local_34 < iNumFaces) &&
       (uVar4 = (ulong)local_34,
       sVar5 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::size
                         (&(stack0xffffffffffffffe0->
                           super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces),
       uVar1 = local_30, uVar4 < sVar5)) {
      pvVar6 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                         (&(stack0xffffffffffffffe0->
                           super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,(ulong)local_34)
      ;
      uVar2 = iIndex;
      pvVar6->mColorIndices[0] = uVar1;
      pvVar6 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                         (&(stack0xffffffffffffffe0->
                           super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,(ulong)local_34)
      ;
      uVar1 = aiValues[0];
      pvVar6->mColorIndices[1] = uVar2;
      pvVar6 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                         (&(stack0xffffffffffffffe0->
                           super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,(ulong)local_34)
      ;
      pvVar6->mColorIndices[2] = uVar1;
    }
    else {
      LogWarning(this,"UV-Face has an invalid index. It will be ignored");
    }
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshCFaceListBlock(unsigned int iNumFaces, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Face entry
            if (TokenMatch(filePtr,"MESH_CFACE" ,10))
            {
                unsigned int aiValues[3];
                unsigned int iIndex = 0;

                ParseLV4MeshLongTriple(aiValues,iIndex);
                if (iIndex >= iNumFaces || iIndex >= mesh.mFaces.size())
                {
                    LogWarning("UV-Face has an invalid index. It will be ignored");
                }
                else
                {
                    // copy color indices
                    mesh.mFaces[iIndex].mColorIndices[0] = aiValues[0];
                    mesh.mFaces[iIndex].mColorIndices[1] = aiValues[1];
                    mesh.mFaces[iIndex].mColorIndices[2] = aiValues[2];
                }
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_CFACE_LIST");
    }
    return;
}